

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

QString * __thiscall
QResourceFileEngine::fileName
          (QString *__return_storage_ptr__,QResourceFileEngine *this,FileName file)

{
  int iVar1;
  QAbstractFileEnginePrivate *pQVar2;
  QResourcePrivate *pQVar3;
  Data *pDVar4;
  QArrayData *data;
  char16_t *pcVar5;
  qsizetype qVar6;
  ulong uVar7;
  storage_type *psVar8;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QString local_68;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QAbstractFileEngine).d_ptr.d;
  if ((file == AbsolutePathName) || (file == PathName)) {
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    if (file == AbsolutePathName) {
      pQVar3 = *(QResourcePrivate **)&pQVar2[1].fileError;
      QResourcePrivate::ensureInitialized(pQVar3);
      local_68.d.d = (pQVar3->absoluteFilePath).d.d;
      local_68.d.ptr = (pQVar3->absoluteFilePath).d.ptr;
      local_68.d.size = (pQVar3->absoluteFilePath).d.size;
    }
    else {
      pQVar3 = *(QResourcePrivate **)&pQVar2[1].fileError;
      QResourcePrivate::ensureInitialized(pQVar3);
      local_68.d.d = (pQVar3->fileName).d.d;
      local_68.d.ptr = (pQVar3->fileName).d.ptr;
      local_68.d.size = (pQVar3->fileName).d.size;
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    psVar8 = (storage_type *)0x1;
    uVar7 = QString::lastIndexOf(&local_68,(QChar)0x2f,-1,CaseSensitive);
    if (uVar7 == 0xffffffffffffffff) {
      ba_00.m_data = psVar8;
      ba_00.m_size = (qsizetype)":";
      QString::fromLatin1(&local_48,(QString *)0x1,ba_00);
LAB_002554f9:
      qVar6 = local_48.d.size;
      pcVar5 = local_48.d.ptr;
      pDVar4 = local_48.d.d;
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).d = pDVar4;
      (__return_storage_ptr__->d).ptr = pcVar5;
      local_48.d.size = 0;
      (__return_storage_ptr__->d).size = qVar6;
    }
    else {
      if ((long)uVar7 < 2) {
        ba.m_data = psVar8;
        ba.m_size = (qsizetype)":/";
        QString::fromLatin1(&local_48,(QString *)0x2,ba);
        goto LAB_002554f9;
      }
      if (uVar7 < (ulong)local_68.d.size) {
        QString::QString(__return_storage_ptr__,(QChar *)local_68.d.ptr,uVar7);
      }
      else {
        (__return_storage_ptr__->d).d = local_68.d.d;
        (__return_storage_ptr__->d).ptr = local_68.d.ptr;
        (__return_storage_ptr__->d).size = local_68.d.size;
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
      }
    }
    if (&(local_68.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00255590;
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    data = &(local_68.d.d)->super_QArrayData;
  }
  else {
    if (file == BaseName) {
      pQVar3 = *(QResourcePrivate **)&pQVar2[1].fileError;
      QResourcePrivate::ensureInitialized(pQVar3);
      local_48.d.d = (pQVar3->fileName).d.d;
      local_48.d.ptr = (pQVar3->fileName).d.ptr;
      local_48.d.size = (pQVar3->fileName).d.size;
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      qVar6 = QString::lastIndexOf(&local_48,(QChar)0x2f,-1,CaseSensitive);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (qVar6 == -1) {
LAB_002554af:
        pQVar3 = *(QResourcePrivate **)&pQVar2[1].fileError;
        QResourcePrivate::ensureInitialized(pQVar3);
        pDVar4 = (pQVar3->fileName).d.d;
        (__return_storage_ptr__->d).d = pDVar4;
        (__return_storage_ptr__->d).ptr = (pQVar3->fileName).d.ptr;
        (__return_storage_ptr__->d).size = (pQVar3->fileName).d.size;
        if (pDVar4 != (Data *)0x0) {
          LOCK();
          (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        goto LAB_00255590;
      }
      pQVar3 = *(QResourcePrivate **)&pQVar2[1].fileError;
      QResourcePrivate::ensureInitialized(pQVar3);
      local_48.d.d = (pQVar3->fileName).d.d;
      local_48.d.ptr = (pQVar3->fileName).d.ptr;
      local_48.d.size = (pQVar3->fileName).d.size;
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::mid(__return_storage_ptr__,&local_48,qVar6 + 1,-1);
    }
    else {
      if ((file & ~BaseName) != CanonicalName) goto LAB_002554af;
      local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar3 = *(QResourcePrivate **)&pQVar2[1].fileError;
      QResourcePrivate::ensureInitialized(pQVar3);
      local_48.d.d = (pQVar3->absoluteFilePath).d.d;
      local_48.d.ptr = (pQVar3->absoluteFilePath).d.ptr;
      local_48.d.size = (pQVar3->absoluteFilePath).d.size;
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if ((file == CanonicalPathName) &&
         (uVar7 = QString::lastIndexOf(&local_48,(QChar)0x2f,-1,CaseSensitive),
         uVar7 != 0xffffffffffffffff)) {
        if (uVar7 < (ulong)local_48.d.size) {
          QString::QString(__return_storage_ptr__,(QChar *)local_48.d.ptr,uVar7);
          goto LAB_0025556d;
        }
        (__return_storage_ptr__->d).d = local_48.d.d;
        (__return_storage_ptr__->d).ptr = local_48.d.ptr;
      }
      else {
        (__return_storage_ptr__->d).d = local_48.d.d;
        (__return_storage_ptr__->d).ptr = local_48.d.ptr;
      }
      (__return_storage_ptr__->d).size = local_48.d.size;
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
LAB_0025556d:
    if (&(local_48.d.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_00255590;
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    data = &(local_48.d.d)->super_QArrayData;
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(data,2,0x10);
  }
LAB_00255590:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QResourceFileEngine::fileName(FileName file) const
{
    Q_D(const QResourceFileEngine);
    if (file == BaseName) {
        const qsizetype slash = d->resource.fileName().lastIndexOf(u'/');
        if (slash == -1)
            return d->resource.fileName();
        return d->resource.fileName().mid(slash + 1);
    } else if (file == PathName || file == AbsolutePathName) {
        const QString path = (file == AbsolutePathName) ? d->resource.absoluteFilePath()
                                                        : d->resource.fileName();
        const qsizetype slash = path.lastIndexOf(u'/');
        if (slash == -1)
            return ":"_L1;
        else if (slash <= 1)
            return ":/"_L1;
        return path.left(slash);

    } else if (file == CanonicalName || file == CanonicalPathName) {
        const QString absoluteFilePath = d->resource.absoluteFilePath();
        if (file == CanonicalPathName) {
            const qsizetype slash = absoluteFilePath.lastIndexOf(u'/');
            if (slash != -1)
                return absoluteFilePath.left(slash);
        }
        return absoluteFilePath;
    }
    return d->resource.fileName();
}